

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsender.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  SocketLog *this;
  ulong uVar2;
  char buf [1024];
  allocator local_479;
  _Any_data local_478;
  code *local_468;
  code *local_460;
  string local_458;
  char local_438 [1032];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Send string every 1s...");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = SocketLog::getInstance();
  local_478._M_unused._M_object = (void *)0x0;
  local_478._8_8_ = 0;
  local_460 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]SocketLog/examples/loopsender.cpp:12:35)>
              ::_M_invoke;
  local_468 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]SocketLog/examples/loopsender.cpp:12:35)>
              ::_M_manager;
  SocketLog::setSendInterceptor(this,(Interceptor *)&local_478);
  std::_Function_base::~_Function_base((_Function_base *)&local_478);
  uVar2 = 0;
  do {
    sprintf(local_438,"hello, count=%d\n",uVar2);
    poVar1 = std::operator<<((ostream *)&std::cout,"try to send:");
    std::operator<<(poVar1,local_438);
    std::__cxx11::string::string((string *)&local_458,local_438,&local_479);
    SocketLog::post(this,&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    local_458._M_dataplus._M_p = (pointer)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&local_458);
    uVar2 = (ulong)((int)uVar2 + 1);
  } while( true );
}

Assistant:

int main() {
    cout<<"Send string every 1s..."<<endl;

    auto socketLog = SocketLog::getInstance();

    socketLog->setSendInterceptor([](const std::string msg) {
        cout<<"SendInterceptor: "<<msg<<endl;
        return false;
    });

    char buf[1024];
    int count = 0;
    while (true) {
        sprintf(buf, "hello, count=%d\n", count++);
        cout<<"try to send:"<<buf;
        socketLog->post(buf);
        std::this_thread::sleep_for(std::chrono::seconds(1));
    }
    return 0;
}